

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O3

void __thiscall
ary::PlaneTracker::initialize
          (PlaneTracker *this,Mat *image,SharedPlanarLocalization *localization,int id)

{
  Mat *pMVar1;
  undefined8 uVar2;
  pointer pPVar3;
  pointer pPVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  _OutputArray *p_Var7;
  pointer pPVar8;
  ulong uVar9;
  int mask_npoints;
  Matx31f translation;
  _OutputArray local_160;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> mask_points;
  CameraModel *local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  Point_<float> local_110;
  undefined1 local_108 [8];
  undefined1 local_100 [8];
  undefined8 uStack_f8;
  uchar *local_f0;
  Matx33f rotation;
  Point *mask_points_ptr;
  undefined8 local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  Size local_50;
  Point3_<float> local_3c;
  
  rotation.val._8_8_ = rotation.val._0_8_;
  cv::Mat::clone();
  cv::Mat::operator=(&this->previous,(Mat *)local_108);
  cv::Mat::~Mat((Mat *)local_108);
  PlanarLocalization::getPlaneCorners
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_108,
             (localization->super_shared_ptr<ary::PlanarLocalization>).
             super___shared_ptr<ary::PlanarLocalization,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator=
            (&this->plane_corners,
             (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_108);
  if ((Point_<int>)local_108 != (Point_<int>)0x0) {
    operator_delete((void *)local_108);
  }
  PlanarLocalization::getPlaneSize
            ((localization->super_shared_ptr<ary::PlanarLocalization>).
             super___shared_ptr<ary::PlanarLocalization,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  (this->plane_size).width = (int)ROUND((float)local_108._0_4_);
  (this->plane_size).height = (int)ROUND((float)local_108._4_4_);
  pMVar1 = &this->mask;
  uVar2 = *(undefined8 *)(this->previous).size.p;
  local_70 = CONCAT44((int)uVar2,(int)((ulong)uVar2 >> 0x20));
  cv::Mat::create(pMVar1,&local_70,0);
  auVar5._8_8_ = 0;
  auVar5._0_4_ = rotation.val[2];
  auVar5._4_4_ = rotation.val[3];
  rotation.val._0_16_ = auVar5 << 0x40;
  local_108._0_4_ = -0x3efdfffa;
  uStack_f8 = 0x100000001;
  local_100 = (undefined1  [8])&rotation;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)pMVar1,(_InputArray *)local_108);
  mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar8 = (this->plane_corners).
           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar3 = (this->plane_corners).
           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  mask_npoints = (int)((ulong)((long)pPVar3 - (long)pPVar8) >> 3);
  mask_points_ptr = (pointer)0x0;
  if (pPVar3 != pPVar8) {
    uVar9 = 0;
    do {
      local_108._0_4_ = (undefined4)pPVar8[uVar9].x;
      local_108._4_4_ = (undefined4)pPVar8[uVar9].y;
      std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<cv::Point_<int>>
                ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&mask_points,
                 (Point_<int> *)local_108);
      uVar9 = uVar9 + 1;
      pPVar8 = (this->plane_corners).
               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->plane_corners).
                                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar8 >> 3));
    mask_points_ptr =
         mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  rotation.val[4] = 0.0;
  rotation.val[5] = 0.0;
  rotation.val[0] = 3.7909693e-37;
  rotation.val._8_8_ = pMVar1;
  local_108._0_4_ = 0;
  local_108._4_4_ = 0x406fe000;
  _local_100 = (undefined1  [16])0x0;
  local_f0 = (uchar *)0x0;
  local_68 = 0;
  cv::fillPoly(&rotation,&mask_points_ptr,&mask_npoints,1,local_108,8,0,&local_68);
  local_108._0_4_ = 0x1010000;
  uStack_f8 = 0;
  local_100 = (undefined1  [8])image;
  auVar6._8_8_ = 0;
  auVar6._0_4_ = rotation.val[6];
  auVar6._4_4_ = rotation.val[7];
  rotation.val._16_16_ = auVar6 << 0x40;
  rotation.val[0] = -9.624375e-38;
  rotation.val._8_8_ = &this->keypoints_current;
  local_50.width = 0;
  local_50.height = 0;
  local_60._0_4_ = 2.3693558e-38;
  local_60._8_8_ = pMVar1;
  cv::goodFeaturesToTrack
            ((_InputArray *)local_108,(_OutputArray *)&rotation,1000,0.1,2.0,(_InputArray *)local_60
             ,3,false,0.04);
  pPVar4 = (this->keypoints_start).
           super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->keypoints_start).
      super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar4) {
    (this->keypoints_start).
    super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar4;
  }
  rotation.val[8] = 0.0;
  rotation.val[4] = 0.0;
  rotation.val[5] = 0.0;
  rotation.val[6] = 0.0;
  rotation.val[7] = 0.0;
  rotation.val[0] = 0.0;
  rotation.val[1] = 0.0;
  rotation.val[2] = 0.0;
  rotation.val[3] = 0.0;
  translation.val[2] = 0.0;
  translation.val[0] = 0.0;
  translation.val[1] = 0.0;
  (*(((localization->super_shared_ptr<ary::PlanarLocalization>).
      super___shared_ptr<ary::PlanarLocalization,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_Localization)._vptr_Localization[2])(local_60);
  local_108._0_4_ = -0x3efdfffb;
  uStack_f8 = 0x300000001;
  local_100 = (undefined1  [8])local_60;
  local_160.super__InputArray.flags = -0x3dfdfffb;
  local_160.super__InputArray.sz.width = 3;
  local_160.super__InputArray.sz.height = 3;
  local_160.super__InputArray.obj = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&rotation;
  p_Var7 = (_OutputArray *)cv::noArray();
  cv::Rodrigues((_InputArray *)local_108,&local_160,p_Var7);
  (*(((localization->super_shared_ptr<ary::PlanarLocalization>).
      super___shared_ptr<ary::PlanarLocalization,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_Localization)._vptr_Localization[2])(local_108);
  auVar5 = _local_100;
  translation.val[2] = uStack_f8._4_4_;
  translation.val[0] = (float)local_100._4_4_;
  translation.val[1] = (float)uStack_f8;
  pPVar8 = (this->keypoints_current).
           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  _local_100 = auVar5;
  if ((this->keypoints_current).
      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar8) {
    uVar9 = 0;
    do {
      local_110 = pPVar8[uVar9];
      CameraUser::getCameraModel(&this->super_CameraUser);
      CameraModel::getIntrinsics
                ((CameraModel *)
                 CONCAT44(local_160.super__InputArray._4_4_,local_160.super__InputArray.flags));
      CameraUser::getCameraModel(&this->super_CameraUser);
      CameraModel::getDistortion((Mat *)local_108,local_120);
      unprojectPoint((ary *)&local_3c,&local_110,&rotation,&translation,(Matx33f *)local_60,
                     (Mat *)local_108);
      std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
      emplace_back<cv::Point3_<float>>
                ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)
                 &this->keypoints_start,&local_3c);
      cv::Mat::~Mat((Mat *)local_108);
      if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160.super__InputArray.obj !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160.super__InputArray.obj);
      }
      uVar9 = uVar9 + 1;
      pPVar8 = (this->keypoints_current).
               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->keypoints_current).
                                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar8 >> 3));
  }
  this->age = 0;
  this->identifier = id;
  if (mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(mask_points.
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PlaneTracker::initialize(const Mat& image, SharedPlanarLocalization localization, int id) {
	previous = image.clone();

	plane_corners = localization->getPlaneCorners();
	plane_size = localization->getPlaneSize();

	mask.create(previous.size(), CV_8UC1); mask.setTo(0);
	vector<Point> mask_points;
	int mask_npoints = plane_corners.size();
	for (int i = 0; i < plane_corners.size(); i++) {
		mask_points.push_back(Point(plane_corners[i].x, plane_corners[i].y));
	}
	const Point* mask_points_ptr = &(mask_points[0]);

	fillPoly(mask, &mask_points_ptr, &mask_npoints, 1, Scalar(255));
	goodFeaturesToTrack(image, keypoints_current, 1000, 0.1, 2, mask);

	keypoints_start.clear();

	Matx33f rotation;
	Matx31f translation;
	Rodrigues(localization->getCameraPosition().rotation, rotation);
	translation = localization->getCameraPosition().translation;

	Matx31f p;
	for (int i = 0; i < keypoints_current.size(); i++) {
		keypoints_start.push_back(unprojectPoint(keypoints_current[i], rotation, translation, getCameraModel()->getIntrinsics(), getCameraModel()->getDistortion()));
	}
/*
	vector<Point2f> image_points2;
	projectPoints(keypoints_start, camera.rotation, camera.translation, getCamera()->getIntrinsics(), getCamera()->getDistortion(), image_points2);

	Mat test;
	image.copyTo(test);

	for (int i = 0; i < keypoints_start.size(); i++) {
		line(test, image_points2[i], keypoints_current[i], Scalar(255), 2);
	cout <<  keypoints_current[i] << image_points2[i] << keypoints_start[i] << endl;

	}

	imshow("Test", test);
	waitKey(0);*/

    age = 0;
    identifier = id;

}